

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprinter.cc
# Opt level: O2

string * tinyusdz::print_typed_timesamples<bool>
                   (string *__return_storage_ptr__,TypedTimeSamples<bool> *v,uint32_t indent)

{
  vector<tinyusdz::TypedTimeSamples<bool>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<bool>::Sample>_>
  *pvVar1;
  ostream *poVar2;
  uint32_t extraout_EDX;
  uint32_t n;
  uint32_t extraout_EDX_00;
  long lVar3;
  size_t i;
  ulong uVar4;
  stringstream ss;
  string local_1d8;
  stringstream local_1b8 [16];
  ostream local_1a8 [376];
  
  ::std::__cxx11::stringstream::stringstream(local_1b8);
  ::std::operator<<(local_1a8,"{\n");
  pvVar1 = TypedTimeSamples<bool>::get_samples(v);
  lVar3 = 0;
  n = extraout_EDX;
  for (uVar4 = 0;
      uVar4 < (ulong)((long)(pvVar1->
                            super__Vector_base<tinyusdz::TypedTimeSamples<bool>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<bool>::Sample>_>
                            )._M_impl.super__Vector_impl_data._M_finish -
                      (long)(pvVar1->
                            super__Vector_base<tinyusdz::TypedTimeSamples<bool>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<bool>::Sample>_>
                            )._M_impl.super__Vector_impl_data._M_start >> 4); uVar4 = uVar4 + 1) {
    pprint::Indent_abi_cxx11_(&local_1d8,(pprint *)(ulong)(indent + 1),n);
    ::std::operator<<(local_1a8,(string *)&local_1d8);
    poVar2 = ::std::ostream::_M_insert<double>
                       (*(double *)
                         ((long)&((pvVar1->
                                  super__Vector_base<tinyusdz::TypedTimeSamples<bool>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<bool>::Sample>_>
                                  )._M_impl.super__Vector_impl_data._M_start)->t + lVar3));
    ::std::operator<<(poVar2,": ");
    ::std::__cxx11::string::_M_dispose();
    if ((&((pvVar1->
           super__Vector_base<tinyusdz::TypedTimeSamples<bool>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<bool>::Sample>_>
           )._M_impl.super__Vector_impl_data._M_start)->blocked)[lVar3] == true) {
      ::std::operator<<(local_1a8,"None");
    }
    else {
      ::std::ostream::_M_insert<bool>(SUB81(local_1a8,0));
    }
    ::std::operator<<(local_1a8,",\n");
    lVar3 = lVar3 + 0x10;
    n = extraout_EDX_00;
  }
  pprint::Indent_abi_cxx11_(&local_1d8,(pprint *)(ulong)indent,n);
  poVar2 = ::std::operator<<(local_1a8,(string *)&local_1d8);
  ::std::operator<<(poVar2,"}\n");
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::stringbuf::str();
  ::std::__cxx11::stringstream::~stringstream(local_1b8);
  return __return_storage_ptr__;
}

Assistant:

std::string print_typed_timesamples(const TypedTimeSamples<T> &v,
                                    const uint32_t indent = 0) {
  std::stringstream ss;

  ss << "{\n";

  const auto &samples = v.get_samples();

  for (size_t i = 0; i < samples.size(); i++) {
    ss << pprint::Indent(indent + 1) << samples[i].t << ": ";
    if (samples[i].blocked) {
      ss << "None";
    } else {
      ss << samples[i].value;
    }
    ss << ",\n";
  }

  ss << pprint::Indent(indent) << "}\n";

  return ss.str();
}